

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O1

int32_t uprv_compareInvEbcdicAsAscii_63(char *s1,char *s2)

{
  byte bVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  
  bVar6 = *s1;
  bVar3 = *s2;
  if (bVar6 == bVar3) {
    lVar2 = 1;
    do {
      if (bVar6 == 0) {
        return 0;
      }
      bVar6 = s1[lVar2];
      bVar3 = s2[lVar2];
      lVar2 = lVar2 + 1;
    } while (bVar6 == bVar3);
  }
  uVar4 = 0;
  uVar5 = 0;
  if (bVar6 != 0) {
    bVar1 = ""[bVar6];
    uVar5 = (uint)bVar1;
    if ((bVar1 == 0) || ((invariantChars[bVar1 >> 5] >> (bVar1 & 0x1f) & 1) == 0)) {
      uVar5 = -(uint)bVar6;
    }
  }
  if (bVar3 != 0) {
    bVar6 = ""[bVar3];
    uVar4 = (uint)bVar6;
    if ((bVar6 == 0) || ((invariantChars[bVar6 >> 5] >> (bVar6 & 0x1f) & 1) == 0)) {
      uVar4 = -(uint)bVar3;
    }
  }
  return uVar5 - uVar4;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uprv_compareInvEbcdicAsAscii(const char *s1, const char *s2) {
    int32_t c1, c2;

    for(;; ++s1, ++s2) {
        c1=(uint8_t)*s1;
        c2=(uint8_t)*s2;
        if(c1!=c2) {
            if(c1!=0 && ((c1=asciiFromEbcdic[c1])==0 || !UCHAR_IS_INVARIANT(c1))) {
                c1=-(int32_t)(uint8_t)*s1;
            }
            if(c2!=0 && ((c2=asciiFromEbcdic[c2])==0 || !UCHAR_IS_INVARIANT(c2))) {
                c2=-(int32_t)(uint8_t)*s2;
            }
            return c1-c2;
        } else if(c1==0) {
            return 0;
        }
    }
}